

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall
absl::strings_internal::BigUnsigned<4>::MultiplyByFiveToTheNth(BigUnsigned<4> *this,int n)

{
  int in_ESI;
  undefined4 local_c;
  
  for (local_c = in_ESI; 0xc < local_c; local_c = local_c + -0xd) {
    MultiplyBy(this,n);
  }
  if (0 < local_c) {
    MultiplyBy(this,n);
  }
  return;
}

Assistant:

void MultiplyByFiveToTheNth(int n) {
    while (n >= kMaxSmallPowerOfFive) {
      MultiplyBy(kFiveToNth[kMaxSmallPowerOfFive]);
      n -= kMaxSmallPowerOfFive;
    }
    if (n > 0) {
      MultiplyBy(kFiveToNth[n]);
    }
  }